

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logging.cc
# Opt level: O0

void __thiscall
muduo::Logger::Impl::Impl(Impl *this,LogLevel level,int savedErrno,SourceFile *file,int line)

{
  int64_t iVar1;
  T v;
  T v_00;
  uint len;
  Timestamp TVar2;
  char *str;
  self *str_00;
  int64_t *in_RCX;
  int in_EDX;
  uint in_ESI;
  int64_t *in_RDI;
  undefined4 in_R8D;
  Impl *in_stack_000000b0;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  LogStream *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  LogStream *this_00;
  T local_50;
  T local_40 [2];
  undefined4 local_1c;
  int64_t *local_18;
  int local_10;
  uint local_c;
  
  local_1c = in_R8D;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  TVar2 = Timestamp::now();
  *in_RDI = TVar2.microSecondsSinceEpoch_;
  memset(in_RDI + 1,0,0xfb8);
  LogStream::LogStream((LogStream *)0x145366);
  *(uint *)(in_RDI + 0x1f8) = local_c;
  *(undefined4 *)((long)in_RDI + 0xfc4) = local_1c;
  iVar1 = local_18[1];
  in_RDI[0x1f9] = *local_18;
  in_RDI[0x1fa] = iVar1;
  formatTime(in_stack_000000b0);
  CurrentThread::tid();
  str = CurrentThread::tidString();
  len = CurrentThread::tidStringLength();
  T::T(local_40,str,len);
  v.str_._4_4_ = in_stack_ffffffffffffff5c;
  v.str_._0_4_ = in_stack_ffffffffffffff58;
  v._8_8_ = in_stack_ffffffffffffff60;
  operator<<((LogStream *)0x1453f2,v);
  T::T(&local_50,*(char **)(LogLevelName + (ulong)local_c * 8),6);
  v_00.str_._4_4_ = in_stack_ffffffffffffff5c;
  v_00.str_._0_4_ = in_stack_ffffffffffffff58;
  v_00._8_8_ = in_stack_ffffffffffffff60;
  operator<<((LogStream *)0x14543a,v_00);
  if (local_10 != 0) {
    this_00 = (LogStream *)(in_RDI + 1);
    strerror_tl(0);
    LogStream::operator<<(this_00,in_stack_ffffffffffffff68);
    str_00 = LogStream::operator<<(this_00,in_stack_ffffffffffffff68);
    LogStream::operator<<(in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
    LogStream::operator<<(this_00,(char *)str_00);
  }
  return;
}

Assistant:

Logger::Impl::Impl(LogLevel level, int savedErrno, const SourceFile& file, int line)
  : time_(Timestamp::now()),
    stream_(),
    level_(level),
    line_(line),
    basename_(file)
{
  formatTime();
  CurrentThread::tid();
  stream_ << T(CurrentThread::tidString(), CurrentThread::tidStringLength());
  stream_ << T(LogLevelName[level], 6);
  if (savedErrno != 0)
  {
    stream_ << strerror_tl(savedErrno) << " (errno=" << savedErrno << ") ";
  }
}